

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsData.cpp
# Opt level: O1

HelicsTime helicsDataBufferToTime(HelicsDataBuffer data)

{
  double dVar1;
  DataType baseType;
  Message *pMVar2;
  Time val;
  Time local_30;
  data_view local_28;
  
  if ((data == (HelicsDataBuffer)0x0) || (*(int *)((long)data + 0x5c) != 0x24ea663f)) {
    pMVar2 = getMessageObj(data,(HelicsError *)0x0);
    data = &pMVar2->data;
    if (pMVar2 == (Message *)0x0) {
      data = (SmallBuffer *)0x0;
    }
  }
  if ((SmallBuffer *)data == (SmallBuffer *)0x0) {
    dVar1 = -1.785e+39;
  }
  else {
    local_28.dblock._M_len = ((SmallBuffer *)data)->bufferSize;
    local_28.dblock._M_str = (char *)((SmallBuffer *)data)->heap;
    local_28.ref.super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_28.ref.super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    baseType = helics::detail::detectType((byte *)local_28.dblock._M_str);
    helics::valueExtract(&local_28,baseType,&local_30);
    if (local_28.ref.super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_28.ref.
                 super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    dVar1 = (double)(local_30.internalTimeCode % 1000000000) * 1e-09 +
            (double)(local_30.internalTimeCode / 1000000000);
  }
  return dVar1;
}

Assistant:

helics::SmallBuffer* getBuffer(HelicsDataBuffer data)
{
    auto* ptr = reinterpret_cast<helics::SmallBuffer*>(data);
    if (ptr != nullptr && ptr->userKey == gBufferValidationIdentifier) {
        return ptr;
    }
    auto* message = getMessageObj(data, nullptr);
    if (message != nullptr) {
        return &message->data;
    }
    return nullptr;
}